

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O1

void __thiscall bubbleJson::BubbleJson::EncodeUTF8(BubbleJson *this,uint number)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  
  if (0x7f < number) {
    if (number < 0x800) {
      bVar3 = (byte)(number >> 6) | 0xc0;
    }
    else {
      if (number < 0x10000) {
        bVar3 = (byte)(number >> 0xc) | 0xe0;
      }
      else {
        if (0x10ffff < number) {
          return;
        }
        pbVar1 = (byte *)ContextPush(this,1);
        *pbVar1 = (byte)(number >> 0x12) | 0xf0;
        bVar3 = (byte)(number >> 0xc) & 0x3f | 0x80;
      }
      pbVar1 = (byte *)ContextPush(this,1);
      *pbVar1 = bVar3;
      bVar3 = (byte)(number >> 6) & 0x3f | 0x80;
    }
    pbVar1 = (byte *)ContextPush(this,1);
    *pbVar1 = bVar3;
    number = (uint)((byte)number & 0x3f | 0x80);
  }
  puVar2 = (undefined1 *)ContextPush(this,1);
  *puVar2 = (char)number;
  return;
}

Assistant:

void BubbleJson::EncodeUTF8(unsigned number)
{
    if (number <= 0x7F)
        ContextPushChar(number & 0xFF);
    else if (number <= 0x7FF)
    {
        ContextPushChar(0xC0 | ((number >> 6) & 0xFF));
        ContextPushChar(0x80 | ((number) & 0x3F));
    }
    else if (number <= 0xFFFF)
    {
        ContextPushChar(0xE0 | ((number >> 12) & 0xFF));
        ContextPushChar(0x80 | ((number >> 6) & 0x3F));
        ContextPushChar(0x80 | ((number) & 0x3F));
    }
    else if (number <= 0x10FFFF)
    {
        ContextPushChar(0xF0 | ((number >> 18) & 0xFF));
        ContextPushChar(0x80 | ((number >> 12) & 0x3F));
        ContextPushChar(0x80 | ((number >> 6) & 0x3F));
        ContextPushChar(0x80 | ((number) & 0x3F));
    }
}